

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

ctrl_t * __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
::control(raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
          *this)

{
  bool bVar1;
  
  bVar1 = is_soo(this);
  if (!bVar1) {
    return (this->settings_).
           super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  }
  __assert_fail("!is_soo()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xf74,
                "ctrl_t *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>>::control() const [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>]"
               );
}

Assistant:

ctrl_t* control() const {
    assert(!is_soo());
    return common().control();
  }